

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O3

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::callFooWhenResolved
          (TestMoreStuffImpl *this,CallFooWhenResolvedContext context)

{
  word *pwVar1;
  PromiseNode *pPVar2;
  undefined8 *puVar3;
  long *plVar4;
  undefined8 uVar5;
  int iVar6;
  TransformPromiseNodeBase *this_00;
  undefined8 *in_RDX;
  PromiseNode *extraout_RDX;
  bool bVar7;
  Promise<void> PVar8;
  Own<kj::_::ChainPromiseNode> OVar9;
  Reader params;
  Own<kj::_::PromiseNode> local_b8;
  undefined1 local_a8 [32];
  Own<kj::_::PromiseNode> local_88;
  PointerReader local_78;
  StructReader local_58;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  (**(code **)*in_RDX)(&local_78);
  local_a8._16_8_ = local_78.pointer;
  local_a8._24_8_ = local_78._24_8_;
  PointerReader::getStruct(&local_58,(PointerReader *)local_a8,(word *)0x0);
  bVar7 = local_58.pointerCount != 0;
  local_a8._16_8_ = (WirePointer *)0x0;
  if (bVar7) {
    local_a8._16_8_ = local_58.pointers;
  }
  iVar6 = 0x7fffffff;
  if (bVar7) {
    iVar6 = local_58.nestingLimit;
  }
  local_a8._0_4_ = 0;
  local_a8._4_4_ = 0;
  local_a8._8_4_ = 0;
  local_a8._12_4_ = 0;
  if (bVar7) {
    local_a8._0_4_ = local_58.segment._0_4_;
    local_a8._4_4_ = local_58.segment._4_4_;
    local_a8._8_4_ = local_58.capTable._0_4_;
    local_a8._12_4_ = local_58.capTable._4_4_;
  }
  local_a8._24_4_ = iVar6;
  PointerReader::getCapability(&local_78);
  puVar3 = (undefined8 *)CONCAT44(local_78.segment._4_4_,local_78.segment._0_4_);
  plVar4 = (long *)CONCAT44(local_78.capTable._4_4_,local_78.capTable._0_4_);
  PVar8 = ClientHook::whenResolved((ClientHook *)&local_b8);
  (**(code **)(*plVar4 + 0x20))(local_a8 + 8,plVar4,PVar8.super_PromiseBase.node.ptr);
  local_a8._0_8_ = &Capability::Client::typeinfo;
  local_a8._24_8_ = in_RDX;
  this_00 = (TransformPromiseNodeBase *)operator_new(0x48);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,&local_b8,
             kj::_::
             TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++:1043:34),_kj::_::PropagateException>
             ::anon_class_32_2_dc087ca5_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_006120f0;
  pwVar1 = (((SegmentReader *)(local_a8._0_8_ + -0x28))->ptr).ptr;
  pPVar2 = *(PromiseNode **)((long)&pwVar1[1].content + (long)local_a8);
  this_00[1].dependency.disposer = *(Disposer **)(local_a8 + (long)pwVar1);
  this_00[1].dependency.ptr = pPVar2;
  *(undefined8 *)((long)&pwVar1[1].content + (long)local_a8) = 0;
  this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&Capability::Client::typeinfo;
  this_00[1].continuationTracePtr = (void *)local_a8._24_8_;
  local_88.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,capnp::_::TestMoreStuffImpl::callFooWhenResolved(capnp::CallContext<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedParams,capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>)::$_0,kj::_::PropagateException>>
        ::instance;
  local_88.ptr = (PromiseNode *)this_00;
  OVar9 = kj::heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_78,&local_88);
  pPVar2 = local_88.ptr;
  *(undefined4 *)&this->super_Server = local_78.segment._0_4_;
  *(undefined4 *)&(this->super_Server).field_0x4 = local_78.segment._4_4_;
  *(undefined4 *)&(this->super_Server).field_0x8 = local_78.capTable._0_4_;
  *(undefined4 *)&(this->super_Server).field_0xc = local_78.capTable._4_4_;
  if ((TransformPromiseNodeBase *)local_88.ptr != (TransformPromiseNodeBase *)0x0) {
    local_88.ptr = (PromiseNode *)0x0;
    (**(local_88.disposer)->_vptr_Disposer)
              (local_88.disposer,
               ((PromiseNode *)&pPVar2->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar2->_vptr_PromiseNode)->_vptr_PromiseNode,OVar9.ptr);
  }
  uVar5 = local_a8._16_8_;
  if ((WirePointer *)local_a8._16_8_ != (WirePointer *)0x0) {
    local_a8._16_8_ = (WirePointer *)0x0;
    (***(_func_int ***)local_a8._8_8_)
              (local_a8._8_8_,
               (long)&((WireValue<uint32_t>_conflict *)uVar5)->value +
               *(long *)((long)*(WirePointer *)uVar5 + -0x10));
  }
  pPVar2 = local_b8.ptr;
  if (local_b8.ptr != (PromiseNode *)0x0) {
    local_b8.ptr = (PromiseNode *)0x0;
    (**(local_b8.disposer)->_vptr_Disposer)
              (local_b8.disposer,pPVar2->_vptr_PromiseNode[-2] + (long)&pPVar2->_vptr_PromiseNode);
  }
  (**(code **)*puVar3)(puVar3,(long)plVar4 + *(long *)(*plVar4 + -0x10));
  PVar8.super_PromiseBase.node.ptr = extraout_RDX;
  PVar8.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar8.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::callFooWhenResolved(CallFooWhenResolvedContext context) {
  ++callCount;

  auto params = context.getParams();
  auto cap = params.getCap();

  return cap.whenResolved().then([KJ_CPCAP(cap),KJ_CPCAP(context)]() mutable {
    auto request = cap.fooRequest();
    request.setI(123);
    request.setJ(true);

    return request.send().then(
        [KJ_CPCAP(context)](Response<test::TestInterface::FooResults>&& response) mutable {
          EXPECT_EQ("foo", response.getX());
          context.getResults().setS("bar");
        }